

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  long lVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  long in_RSI;
  long *in_RDI;
  int m;
  int v;
  int k;
  int sign;
  int tbl;
  int ci;
  int blkn;
  uchar *st;
  JBLOCKROW block;
  jpeg_component_info *compptr;
  arith_entropy_ptr_conflict entropy;
  undefined2 *local_60;
  uint local_54;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar6;
  int in_stack_ffffffffffffffb8;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  
  lVar1 = in_RDI[0x4a];
  if ((int)in_RDI[0x2e] != 0) {
    if (*(int *)(lVar1 + 0x4c) == 0) {
      process_restart((j_decompress_ptr)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    *(int *)(lVar1 + 0x4c) = *(int *)(lVar1 + 0x4c) + -1;
  }
  if (*(int *)(lVar1 + 0x28) != -1) {
    for (iVar9 = 0; iVar9 < (int)in_RDI[0x3c]; iVar9 = iVar9 + 1) {
      if (in_RSI == 0) {
        local_60 = (undefined2 *)0x0;
      }
      else {
        local_60 = *(undefined2 **)(in_RSI + (long)iVar9 * 8);
      }
      iVar8 = *(int *)((long)in_RDI + (long)iVar9 * 4 + 0x1e4);
      lVar2 = in_RDI[(long)iVar8 + 0x37];
      iVar6 = *(int *)(lVar2 + 0x14);
      iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                           (uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
      if (iVar4 == 0) {
        *(undefined4 *)(lVar1 + 0x3c + (long)iVar8 * 4) = 0;
      }
      else {
        in_stack_ffffffffffffffb8 =
             arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                          (uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
        local_54 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                                (uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
        if (local_54 != 0) {
          while (iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                                      (uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffb8)),
                iVar4 != 0) {
            local_54 = local_54 << 1;
            if (local_54 == 0x8000) {
              *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
              (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
              *(undefined4 *)(lVar1 + 0x28) = 0xffffffff;
              return 1;
            }
          }
        }
        uVar5 = local_54;
        if ((int)local_54 <
            (int)((1L << (*(byte *)((long)in_RDI + (long)iVar6 + 0x140) & 0x3f)) >> 1)) {
          *(undefined4 *)(lVar1 + 0x3c + (long)iVar8 * 4) = 0;
        }
        else if ((int)((1L << (*(byte *)((long)in_RDI + (long)iVar6 + 0x150) & 0x3f)) >> 1) <
                 (int)local_54) {
          *(int *)(lVar1 + 0x3c + (long)iVar8 * 4) = in_stack_ffffffffffffffb8 * 4 + 0xc;
        }
        else {
          *(int *)(lVar1 + 0x3c + (long)iVar8 * 4) = in_stack_ffffffffffffffb8 * 4 + 4;
        }
        while (local_54 = (int)local_54 >> 1, local_54 != 0) {
          iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                               (uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
          if (iVar4 != 0) {
            uVar5 = local_54 | uVar5;
          }
        }
        iVar6 = uVar5 + 1;
        if (in_stack_ffffffffffffffb8 != 0) {
          iVar6 = -iVar6;
        }
        *(uint *)(lVar1 + 0x2c + (long)iVar8 * 4) =
             *(int *)(lVar1 + 0x2c + (long)iVar8 * 4) + iVar6 & 0xffff;
      }
      if (local_60 != (undefined2 *)0x0) {
        *local_60 = (short)*(undefined4 *)(lVar1 + 0x2c + (long)iVar8 * 4);
      }
      uVar7 = *(undefined4 *)(lVar2 + 0x18);
      iVar6 = 1;
      while ((iVar6 < 0x40 &&
             (iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                                   (uchar *)CONCAT44(uVar7,in_stack_ffffffffffffffb8)), iVar4 == 0))
            ) {
        while (iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                                    (uchar *)CONCAT44(uVar7,in_stack_ffffffffffffffb8)), iVar4 == 0)
        {
          iVar6 = iVar6 + 1;
          if (0x3f < iVar6) {
            *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
            (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
            *(undefined4 *)(lVar1 + 0x28) = 0xffffffff;
            return 1;
          }
        }
        in_stack_ffffffffffffffb8 =
             arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                          (uchar *)CONCAT44(uVar7,in_stack_ffffffffffffffb8));
        local_54 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                                (uchar *)CONCAT44(uVar7,in_stack_ffffffffffffffb8));
        uVar5 = local_54;
        if ((local_54 != 0) &&
           (iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                                 (uchar *)CONCAT44(uVar7,in_stack_ffffffffffffffb8)), iVar4 != 0)) {
          local_54 = local_54 << 1;
          while (iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                                      (uchar *)CONCAT44(uVar7,in_stack_ffffffffffffffb8)),
                uVar5 = local_54, iVar4 != 0) {
            local_54 = local_54 << 1;
            if (local_54 == 0x8000) {
              *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
              (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
              *(undefined4 *)(lVar1 + 0x28) = 0xffffffff;
              return 1;
            }
          }
        }
        while (local_54 = (int)local_54 >> 1, local_54 != 0) {
          iVar4 = arith_decode((j_decompress_ptr)CONCAT44(iVar9,iVar8),
                               (uchar *)CONCAT44(uVar7,in_stack_ffffffffffffffb8));
          if (iVar4 != 0) {
            uVar5 = local_54 | uVar5;
          }
        }
        sVar3 = (short)uVar5 + 1;
        if (in_stack_ffffffffffffffb8 != 0) {
          sVar3 = -sVar3;
        }
        if (local_60 != (undefined2 *)0x0) {
          local_60[jpeg_natural_order[iVar6]] = sVar3;
        }
        iVar6 = iVar6 + 1;
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data ? MCU_data[blkn] : NULL;
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2;  st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        st = entropy->dc_stats[tbl] + 20;       /* Table F.4: X1 = 20 */
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;               /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
        entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      entropy->last_dc_val[ci] = (entropy->last_dc_val[ci] + v) & 0xffff;
    }

    if (block)
      (*block)[0] = (JCOEF)entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Figure F.20: Decode_AC_coefficients */
    for (k = 1; k <= DCTSIZE2 - 1; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
      while (arith_decode(cinfo, st + 1) == 0) {
        st += 3;  k++;
        if (k > DCTSIZE2 - 1) {
          WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
          entropy->ct = -1;                     /* spectral overflow */
          return TRUE;
        }
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        if (arith_decode(cinfo, st)) {
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (arith_decode(cinfo, st)) {
            if ((m <<= 1) == 0x8000) {
              WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
              entropy->ct = -1;                 /* magnitude overflow */
              return TRUE;
            }
            st += 1;
          }
        }
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      if (block)
        (*block)[jpeg_natural_order[k]] = (JCOEF)v;
    }
  }

  return TRUE;
}